

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O2

void iemgui_dolabel(void *x,t_iemgui *iemgui,t_symbol *s,int senditup)

{
  t_symbol *ptVar1;
  char *__s1;
  int iVar2;
  t_symbol *ptVar3;
  t_symbol *ptVar4;
  undefined4 extraout_var;
  _glist *p_Var5;
  char *pcVar6;
  char tag [128];
  char local_b8 [136];
  
  pcVar6 = "";
  ptVar3 = gensym("");
  ptVar1 = iemgui->x_lab;
  if ((((s == (t_symbol *)0x0) ||
       (ptVar4 = canvas_realizedollar(iemgui->x_glist,s), ptVar4 == (t_symbol *)0x0)) ||
      (__s1 = ptVar4->s_name, __s1 == (char *)0x0)) ||
     ((*__s1 == '\0' || (iVar2 = strcmp(__s1,"empty"), iVar2 == 0)))) {
    ptVar4 = ptVar3;
  }
  iemgui->x_lab = ptVar4;
  if (senditup < 0) {
    iVar2 = glist_isvisible(iemgui->x_glist);
    if (iVar2 == 0) {
      return;
    }
    senditup = (int)(iemgui->x_lab != ptVar1);
  }
  if (senditup != 0) {
    iVar2 = sprintf(local_b8,"%lxLABEL",x);
    p_Var5 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar2));
    if (ptVar4 != ptVar3) {
      pcVar6 = ptVar4->s_name;
    }
    pdgui_vmess("pdtk_text_set","cs s",p_Var5,local_b8,pcVar6);
    iemgui_dolabelpos((t_object *)x,iemgui);
  }
  return;
}

Assistant:

void iemgui_dolabel(void *x, t_iemgui *iemgui, t_symbol *s, int senditup)
{
    t_symbol *empty = gensym("");
    t_symbol *old = iemgui->x_lab;
    s = s?canvas_realizedollar(iemgui->x_glist, s):0;
    if (!(s && s->s_name && s->s_name[0] && strcmp(s->s_name, "empty")))
        s = empty;
    iemgui->x_lab = s;

    if(senditup < 0) {
        senditup = (glist_isvisible(iemgui->x_glist) && iemgui->x_lab != old);
    }

    if(senditup)
    {
        const char*label = s->s_name;
        int have_label = (s != empty);
        char tag[128];
        sprintf(tag, "%lxLABEL", x);
        pdgui_vmess("pdtk_text_set", "cs s",
            glist_getcanvas(iemgui->x_glist), tag,
            have_label?s->s_name:"");
        iemgui_dolabelpos(x, iemgui);
    }
}